

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O2

void __thiscall
TEST_ComparatorsAndCopiersRepository_InstallCopierAndRetrieveIt_Test::testBody
          (TEST_ComparatorsAndCopiersRepository_InstallCopierAndRetrieveIt_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueCopier *pMVar2;
  TestTerminator *pTVar3;
  SimpleString local_38;
  MockNamedValueComparatorsAndCopiersRepository repository;
  MyCopier copier;
  
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002d3f38;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  SimpleString::SimpleString(&local_38,"MyType");
  MockNamedValueComparatorsAndCopiersRepository::installCopier
            (&repository,&local_38,&copier.super_MockNamedValueCopier);
  SimpleString::~SimpleString(&local_38);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"MyType");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&repository,&local_38);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&copier,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockNamedValueTest.cpp"
             ,0x3d,pTVar3);
  SimpleString::~SimpleString(&local_38);
  MockNamedValueComparatorsAndCopiersRepository::clear(&repository);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  return;
}

Assistant:

MyCopier() {}